

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O2

int __thiscall Qclass::plot(Qclass *this)

{
  ostream *poVar1;
  undefined1 local_c8 [8];
  Gnuplot g1;
  string local_40;
  allocator local_1a;
  allocator local_19;
  
  std::__cxx11::string::string
            ((string *)&local_40,"lines",
             (allocator *)
             &g1.tmpfile_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Gnuplot::Gnuplot((Gnuplot *)local_c8,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  Gnuplot::set_xrange((Gnuplot *)local_c8,-10.0,60.0);
  Gnuplot::set_yrange((Gnuplot *)local_c8,-10.0,60.0);
  std::__cxx11::string::string((string *)&local_40,"Co_ordinates.txt",&local_1a);
  std::__cxx11::string::string
            ((string *)
             &g1.tmpfile_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"Path",&local_19);
  Gnuplot::plotfile_xy
            ((Gnuplot *)local_c8,&local_40,1,2,
             (string *)
             &g1.tmpfile_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &g1.tmpfile_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"Obstacles1.txt",&local_1a);
  std::__cxx11::string::string
            ((string *)
             &g1.tmpfile_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"Obstacles",&local_19);
  Gnuplot::plotfile_xy
            ((Gnuplot *)local_c8,&local_40,1,2,
             (string *)
             &g1.tmpfile_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &g1.tmpfile_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"Obstacles2.txt",&local_1a);
  std::__cxx11::string::string
            ((string *)
             &g1.tmpfile_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"Obstacles",&local_19);
  Gnuplot::plotfile_xy
            ((Gnuplot *)local_c8,&local_40,1,2,
             (string *)
             &g1.tmpfile_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &g1.tmpfile_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,"Press ENTER to continue...");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x108188);
  std::streambuf::in_avail();
  std::istream::ignore((long)&std::cin);
  std::istream::get();
  Gnuplot::~Gnuplot((Gnuplot *)local_c8);
  return 0;
}

Assistant:

int Qclass::plot() {
  try {
    Gnuplot g1("lines");
    // Plots points present in Text files
    g1.set_xrange(-10, 60);
    g1.set_yrange(-10, 60);
    g1.plotfile_xy("Co_ordinates.txt", 1, 2, "Path");
    g1.plotfile_xy("Obstacles1.txt", 1, 2, "Obstacles");
    g1.plotfile_xy("Obstacles2.txt", 1, 2, "Obstacles");

#if defined(unix) || defined(__unix) || defined(__unix__) || defined(__APPLE__)
    std::cout << std::endl << "Press ENTER to continue..." << std::endl;

    std::cin.clear();
    std::cin.ignore(std::cin.rdbuf()->in_avail());
    std::cin.get();
#endif
  } catch (GnuplotException& ge) {
    // std::cout << ge.what() << std::endl;
  }
  return 0;
}